

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O2

void __thiscall qpdf::Tokenizer::inReal(Tokenizer *this,char ch)

{
  bool bVar1;
  
  if (9 < (byte)(ch - 0x30U)) {
    bVar1 = is_delimiter(ch);
    if (bVar1) {
      this->type = tt_real;
      this->state = st_token_ready;
      this->in_token = false;
      this->char_to_unread = ch;
    }
    else {
      this->state = st_literal;
    }
  }
  return;
}

Assistant:

void
Tokenizer::inReal(char ch)
{
    if (util::is_digit(ch)) {
    } else if (isDelimiter(ch)) {
        type = tt::tt_real;
        state = st_token_ready;
        in_token = false;
        char_to_unread = ch;
    } else {
        state = st_literal;
    }
}